

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  iterator iVar2;
  _Base_ptr p_Var3;
  string sStack_78;
  allocator<char> local_51;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"call",(allocator<char> *)&lines);
  instruction(&sStack_78,sos::Instructions::call);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"store",(allocator<char> *)&lines);
  instruction(&sStack_78,sos::Instructions::store);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"load",(allocator<char> *)&lines);
  instruction(&sStack_78,sos::Instructions::load);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"loadr",(allocator<char> *)&lines);
  instruction(&sStack_78,sos::Instructions::loadr);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"goto",(allocator<char> *)&lines);
  instruction(&sStack_78,sos::Instructions::go);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"if",(allocator<char> *)&lines);
  instruction(&sStack_78,sos::Instructions::ifelse);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,anon_var_dwarf_70c6,(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::print);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,anon_var_dwarf_70d1,(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::printr);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,anon_var_dwarf_70dc,(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::read);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,anon_var_dwarf_70e7,(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::kill);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"!",(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::invert);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"&&",(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::boolAnd);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"||",(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::boolOr);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"==",(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::equals);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,">",(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::greater);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,">=",(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::greaterEqual);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"<",(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::less);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_78,"<=",(allocator<char> *)&lines);
  native(&sStack_78,sos::NativeFunction::lessEqual);
  std::__cxx11::string::~string((string *)&sStack_78);
  readFile_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,&lines);
  parseForFunction(&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  poVar1 = std::operator<<((ostream *)&std::cout,"Using ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," instructions.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Loaded ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," functions.");
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)operator_new(0x18);
  (this->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_78,"main",&local_51);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>_>
          ::find(&sos::Instructions::functions_abi_cxx11_._M_t,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &sos::Instructions::functions_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Cannot execute file without main function!");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  (**(code **)**(undefined8 **)(iVar2._M_node + 2))(*(undefined8 **)(iVar2._M_node + 2),this);
  for (p_Var3 = sos::Instructions::functions_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header
                ._M_left;
      (_Rb_tree_header *)p_Var3 !=
      &sos::Instructions::functions_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    operator_delete(*(void **)(p_Var3 + 2),8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
  operator_delete(this,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  return 0;
}

Assistant:

int main() {
    // Load Instruction Set
    instruction("call", Instructions::call);
    instruction("store", Instructions::store);
    instruction("load", Instructions::load);
    instruction("loadr", Instructions::loadr);
    instruction("goto", Instructions::go);
    instruction("if", Instructions::ifelse);

    // Load Native Functions
    native("🖨", NativeFunction::print);
    native("📄", NativeFunction::printr);
    native("💬", NativeFunction::read);
    native("💀", NativeFunction::kill);
    native("!", NativeFunction::invert);
    native("&&", NativeFunction::boolAnd);
    native("||", NativeFunction::boolOr);
    native("==", NativeFunction::equals);
    native(">", NativeFunction::greater);
    native(">=", NativeFunction::greaterEqual);
    native("<", NativeFunction::less);
    native("<=", NativeFunction::lessEqual);


    std::vector<std::string> lines = readFile();
    parseForFunction(lines);

    if (DEBUG) {
        std::cout << "Using " << instructions.size() << " instructions." << std::endl;
        std::cout << "Loaded " << Instructions::functions.size() << " functions." << std::endl;
    }

    auto* stack = new VariableStack();

    auto main = Instructions::functions.find("main");
    if (main == Instructions::functions.end())
        std::cerr << "Cannot execute file without main function!" << std::endl;
    main->second->execute(stack);

    // Deallocate functions
    for(auto & function : Instructions::functions)
        delete function.second;
    delete stack;
    return 0;
}